

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O1

Var __thiscall ScriptMemoryDumper::Dump(ScriptMemoryDumper *this)

{
  long lVar1;
  uint32 *puVar2;
  size_t *psVar3;
  Recycler *pRVar4;
  uint uVar5;
  HeapInfoManager *this_00;
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket;
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket_00;
  BucketType *heapBucket_01;
  uint index;
  size_t sVar6;
  long lVar7;
  
  pRVar4 = this->scriptContext->recycler;
  this_00 = &pRVar4->autoHeap;
  sVar6 = 0x10;
  lVar7 = 0;
  do {
    (this->current).totalByteCount = 0;
    *(undefined8 *)&(this->current).finalizeCount = 0;
    *(undefined8 *)&(this->current).activeObjectCount = 0;
    (this->current).activeObjectByteSize = 0;
    (this->current).pageCount = 0;
    (this->current).objectSize = 0;
    (this->current).freeObjectCount = 0;
    lVar1 = lVar7 + 1;
    heapBucket = &Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)32>
                            (&this_00->defaultHeap,sVar6)->
                  super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>;
    uVar5 = (uint)lVar7;
    DumpHeapBucket<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
              (this,uVar5,heapBucket);
    heapBucket_00 =
         (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)
         Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)0>(&this_00->defaultHeap,sVar6);
    DumpHeapBucket<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
              (this,uVar5,heapBucket_00);
    heapBucket_01 =
         Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)128>(&this_00->defaultHeap,sVar6);
    DumpHeapBucket<SmallAllocationBlockAttributes>(this,uVar5,heapBucket_01);
    SaveCurrentAtIndex(this,uVar5);
    (this->total).pageCount = (this->total).pageCount + (this->current).pageCount;
    puVar2 = &(this->total).activeObjectCount;
    *puVar2 = *puVar2 + (this->current).activeObjectCount;
    psVar3 = &(this->total).activeObjectByteSize;
    *psVar3 = *psVar3 + (this->current).activeObjectByteSize;
    puVar2 = &(this->total).finalizeCount;
    *puVar2 = *puVar2 + (this->current).finalizeCount;
    psVar3 = &(this->total).totalByteCount;
    *psVar3 = *psVar3 + (this->current).totalByteCount;
    puVar2 = &(this->total).freeObjectCount;
    *puVar2 = *puVar2 + (this->current).freeObjectCount;
    sVar6 = sVar6 + 0x10;
    lVar7 = lVar1;
  } while (lVar1 != 0x30);
  sVar6 = 0x310;
  lVar7 = 0;
  do {
    (this->current).totalByteCount = 0;
    *(undefined8 *)&(this->current).finalizeCount = 0;
    *(undefined8 *)&(this->current).activeObjectCount = 0;
    (this->current).activeObjectByteSize = 0;
    (this->current).pageCount = 0;
    (this->current).objectSize = 0;
    (this->current).freeObjectCount = 0;
    lVar1 = lVar7 + 1;
    uVar5 = Memory::HeapInfo::GetMediumBucketIndex(sVar6);
    index = (uint)lVar7;
    DumpHeapBucket<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
              (this,index,
               &(pRVar4->autoHeap).defaultHeap.mediumHeapBuckets[uVar5].leafHeapBucket.
                super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>);
    uVar5 = Memory::HeapInfo::GetMediumBucketIndex(sVar6);
    DumpHeapBucket<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
              (this,index,
               (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *)
               ((pRVar4->autoHeap).defaultHeap.mediumHeapBuckets + uVar5));
    uVar5 = Memory::HeapInfo::GetMediumBucketIndex(sVar6);
    DumpHeapBucket<MediumAllocationBlockAttributes>
              (this,index,
               &(pRVar4->autoHeap).defaultHeap.mediumHeapBuckets[uVar5].finalizableHeapBucket);
    SaveCurrentAtIndex(this,index + 0x30);
    (this->total).pageCount = (this->total).pageCount + (this->current).pageCount;
    puVar2 = &(this->total).activeObjectCount;
    *puVar2 = *puVar2 + (this->current).activeObjectCount;
    psVar3 = &(this->total).activeObjectByteSize;
    *psVar3 = *psVar3 + (this->current).activeObjectByteSize;
    puVar2 = &(this->total).finalizeCount;
    *puVar2 = *puVar2 + (this->current).finalizeCount;
    psVar3 = &(this->total).totalByteCount;
    *psVar3 = *psVar3 + (this->current).totalByteCount;
    puVar2 = &(this->total).freeObjectCount;
    *puVar2 = *puVar2 + (this->current).freeObjectCount;
    sVar6 = sVar6 + 0x10;
    lVar7 = lVar1;
  } while (lVar1 != 0x1d);
  (this->current).totalByteCount = 0;
  *(undefined8 *)&(this->current).finalizeCount = 0;
  *(undefined8 *)&(this->current).activeObjectCount = 0;
  (this->current).activeObjectByteSize = 0;
  (this->current).pageCount = 0;
  (this->current).objectSize = 0;
  (this->current).freeObjectCount = 0;
  DumpLargeBucket(this,&(pRVar4->autoHeap).defaultHeap.largeObjectBucket);
  SaveCurrentAsLargeBlock(this);
  (this->total).pageCount = (this->total).pageCount + (this->current).pageCount;
  puVar2 = &(this->total).activeObjectCount;
  *puVar2 = *puVar2 + (this->current).activeObjectCount;
  psVar3 = &(this->total).activeObjectByteSize;
  *psVar3 = *psVar3 + (this->current).activeObjectByteSize;
  puVar2 = &(this->total).finalizeCount;
  *puVar2 = *puVar2 + (this->current).finalizeCount;
  psVar3 = &(this->total).totalByteCount;
  *psVar3 = *psVar3 + (this->current).totalByteCount;
  puVar2 = &(this->total).freeObjectCount;
  *puVar2 = *puVar2 + (this->current).freeObjectCount;
  SaveSummary(this);
  return this->dumpObject;
}

Assistant:

Js::Var ScriptMemoryDumper::Dump()
{
    Recycler* recycler = scriptContext->GetRecycler();
    HeapInfo* heapInfo = recycler->GetDefaultHeapInfo();

    for (uint32 i = 0 ; i < HeapConstants::BucketCount; i++)
    {
        ResetCurrentStats();
        size_t sizeCat = (i + 1) * HeapConstants::ObjectGranularity;
        DumpHeapBucket(i, &heapInfo->GetBucket<LeafBit>(sizeCat));
        DumpHeapBucket(i, &heapInfo->GetBucket<NoBit>(sizeCat));
        DumpHeapBucket(i, (SmallFinalizableHeapBucket *)&heapInfo->GetBucket<FinalizeBit>(sizeCat));
        SaveCurrentAtIndex(i);
        MergeCurrentStats();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint32 i = 0 ; i < HeapConstants::MediumBucketCount; i++)
    {
        ResetCurrentStats();
        size_t sizeCat = HeapConstants::MaxSmallObjectSize + ((i + 1) * HeapConstants::ObjectGranularity);

#if SMALLBLOCK_MEDIUM_ALLOC
        DumpHeapBucket(i, &heapInfo->GetMediumBucket<LeafBit>(sizeCat));
        DumpHeapBucket(i, &heapInfo->GetMediumBucket<NoBit>(sizeCat));
        DumpHeapBucket(i, (MediumFinalizableHeapBucket *)&heapInfo->GetMediumBucket<FinalizeBit>(sizeCat));
#else
        DumpLargeBucket(&heapInfo->GetMediumBucket(sizeCat));
#endif
        SaveCurrentAtIndex(i + HeapConstants::BucketCount);
        MergeCurrentStats();
    }
#endif

    ResetCurrentStats();
    DumpLargeBucket(&heapInfo->largeObjectBucket);
    SaveCurrentAsLargeBlock();
    MergeCurrentStats();
    SaveSummary();
    return dumpObject;
}